

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::CheckTxInIndex(Psbt *this,uint32_t index,int line,char *caller)

{
  void *pvVar1;
  CfdException *pCVar2;
  allocator local_55;
  uint32_t index_local;
  undefined1 local_50 [32];
  CfdSourceLocation location;
  
  pvVar1 = this->wally_psbt_pointer_;
  index_local = index;
  if (pvVar1 == (void *)0x0) {
    local_50._0_8_ = "cfdcore_psbt.cpp";
    local_50._8_4_ = 0xcf0;
    local_50._16_8_ = "CheckTxInIndex";
    logger::warn<>((CfdSourceLocation *)local_50,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_50,"psbt pointer is null.",(allocator *)&location);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_50);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(long *)((long)pvVar1 + 8) == 0) {
    local_50._0_8_ = "cfdcore_psbt.cpp";
    local_50._8_4_ = 0xcf3;
    local_50._16_8_ = "CheckTxInIndex";
    logger::warn<>((CfdSourceLocation *)local_50,"psbt base tx is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_50,"psbt base tx is null.",(allocator *)&location);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_50);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  location.line = line;
  location.funcname = caller;
  if (*(ulong *)((long)pvVar1 + 0x18) <= (ulong)index) {
    location.filename = "cfdcore_psbt.cpp";
    logger::warn<unsigned_int&>(&location,"psbt vin[{}] out_of_range.",&index_local);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_50,"psbt vin out_of_range error.",&local_55);
    CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)local_50);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((ulong)index < *(ulong *)(*(long *)((long)pvVar1 + 8) + 0x10)) {
    return;
  }
  location.filename = "cfdcore_psbt.cpp";
  logger::warn<unsigned_int&>(&location,"tx vin[{}] out_of_range.",&index_local);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_50,"tx vin out_of_range error.",&local_55);
  CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)local_50);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::CheckTxInIndex(uint32_t index, int line, const char *caller) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  } else if (psbt_pointer->num_inputs <= index) {
    CfdSourceLocation location = {CFD_LOG_FILE, line, caller};
    warn(location, "psbt vin[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "psbt vin out_of_range error.");
  } else if (psbt_pointer->tx->num_inputs <= index) {
    CfdSourceLocation location = {CFD_LOG_FILE, line, caller};
    warn(location, "tx vin[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "tx vin out_of_range error.");
  }
}